

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_NtkTimeSetDefaultInputDrive(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_Time_t *pAVar1;
  Abc_ManTime_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pAVar2 = pNtk->pManTime;
  if (pAVar2 == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  (pAVar2->tInDriveDef).Rise = Rise;
  (pAVar2->tInDriveDef).Fall = Fall;
  if ((pAVar2->tInDrive != (Abc_Time_t *)0x0) && (pVVar3 = pNtk->vCis, 0 < pVVar3->nSize)) {
    lVar4 = 0;
    do {
      pAVar1 = pNtk->pManTime->tInDrive;
      if ((((pAVar1[lVar4].Rise == 0.0) && (!NAN(pAVar1[lVar4].Rise))) &&
          (pAVar1[lVar4].Fall == 0.0)) && (!NAN(pAVar1[lVar4].Fall))) {
        pAVar1[lVar4] = pNtk->pManTime->tInDriveDef;
        pVVar3 = pNtk->vCis;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultInputDrive( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
//    if ( Rise == 0.0 && Fall == 0.0 )
//        return;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tInDriveDef.Rise  = Rise;
    pNtk->pManTime->tInDriveDef.Fall  = Fall;
    if ( pNtk->pManTime->tInDrive != NULL )
    {
        int i;
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pNtk->pManTime->tInDrive[i].Rise == 0 && pNtk->pManTime->tInDrive[i].Fall == 0 )
                pNtk->pManTime->tInDrive[i] = pNtk->pManTime->tInDriveDef;
    }
}